

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd_test.cpp
# Opt level: O0

void __thiscall Optional_Basics_Test::TestBody(Optional_Basics_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  Type type;
  int *piVar9;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  int x;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  optional<int> opt;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  AssertionResult *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  optional<int> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined2 in_stack_fffffffffffffcfc;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  char *in_stack_fffffffffffffd00;
  Type in_stack_fffffffffffffd0c;
  AssertHelper *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  char *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 uVar10;
  undefined1 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  optional<int> *this_01;
  AssertionResult local_278;
  string local_268 [48];
  AssertionResult local_238;
  undefined4 local_224;
  undefined4 local_20c;
  Type local_208;
  undefined4 local_204;
  AssertionResult local_200;
  undefined4 local_1ec;
  undefined4 local_1d4;
  int local_1d0;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  string local_1b8 [48];
  AssertionResult local_188;
  string local_178 [48];
  AssertionResult local_148 [2];
  undefined4 local_124;
  AssertionResult local_120 [2];
  undefined4 local_fc;
  AssertionResult local_f8;
  string local_e8 [48];
  AssertionResult local_b8;
  string local_a8 [48];
  AssertionResult local_78;
  undefined4 local_64;
  string local_60 [64];
  AssertionResult local_20;
  optional<int> local_10 [2];
  
  this_01 = local_10;
  pstd::optional<int>::optional(this_01);
  pstd::optional<int>::has_value(this_01);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         in_stack_fffffffffffffd58)))),
               in_stack_fffffffffffffd50,
               (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         in_stack_fffffffffffffd58)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x621d4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x621dc6);
  local_64 = 1;
  pstd::optional<int>::operator=
            ((optional<int> *)in_stack_fffffffffffffce0,
             (int *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  uVar2 = pstd::optional<int>::has_value(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffd5c,
                                                                     in_stack_fffffffffffffd58)))),
               in_stack_fffffffffffffd50,
               (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffd5c,
                                                                     in_stack_fffffffffffffd58)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_a8);
    testing::Message::~Message((Message *)0x621f16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x621f8e);
  uVar4 = pstd::optional::operator_cast_to_bool((optional *)local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  uVar10 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffd58);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))),
               in_stack_fffffffffffffd50,
               (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x6220bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622134);
  local_fc = 1;
  piVar9 = pstd::optional<int>::value((optional<int> *)in_stack_fffffffffffffce0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )),(char *)in_stack_fffffffffffffcf0,
             (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (int *)in_stack_fffffffffffffce0);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x6221e6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x622243);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622298);
  local_124 = 1;
  pstd::optional<int>::operator*((optional<int> *)0x6222b0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )),(char *)in_stack_fffffffffffffcf0,
             (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (int *)in_stack_fffffffffffffce0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::AssertionResult::failure_message((AssertionResult *)0x62234a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x6223a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6223fc);
  pstd::optional<int>::reset((optional<int> *)in_stack_fffffffffffffce0);
  pstd::optional<int>::has_value(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))),(char *)piVar9
               ,(char *)CONCAT17(uVar6,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_178);
    testing::Message::~Message((Message *)0x62252f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6225a7);
  pstd::optional::operator_cast_to_bool((optional *)local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))),(char *)piVar9
               ,(char *)CONCAT17(uVar6,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_1b8);
    testing::Message::~Message((Message *)0x6226cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622746);
  local_1cc = 2;
  local_1d4 = 2;
  local_1d0 = pstd::optional<int>::value_or
                        (in_stack_fffffffffffffcf0,
                         (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )),(char *)in_stack_fffffffffffffcf0,
             (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (int *)in_stack_fffffffffffffce0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x622818);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x622875);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6228cd);
  local_1ec = 1;
  pstd::optional<int>::operator=
            ((optional<int> *)in_stack_fffffffffffffce0,
             (int *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  local_204 = 1;
  local_20c = 2;
  type = pstd::optional<int>::value_or
                   (in_stack_fffffffffffffcf0,
                    (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  local_208 = type;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )),(char *)in_stack_fffffffffffffcf0,
             (int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (int *)in_stack_fffffffffffffce0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x6229c1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,type,in_stack_fffffffffffffd00,
               CONCAT13(in_stack_fffffffffffffcff,
                        CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x622a1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622a76);
  local_224 = 3;
  pstd::optional<int>::reset((optional<int> *)in_stack_fffffffffffffce0);
  pstd::optional<int>::operator=
            ((optional<int> *)in_stack_fffffffffffffce0,
             (int *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  uVar7 = pstd::optional<int>::has_value(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  uVar8 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!(bool)uVar8) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))),(char *)piVar9
               ,(char *)CONCAT17(uVar6,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,type,in_stack_fffffffffffffd00,
               CONCAT13(uVar7,CONCAT12(uVar8,in_stack_fffffffffffffcfc)),
               (char *)in_stack_fffffffffffffcf0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_268);
    testing::Message::~Message((Message *)0x622bc9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622c41);
  piVar9 = pstd::optional<int>::value((optional<int> *)in_stack_fffffffffffffce0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(uVar7,CONCAT16(uVar8,CONCAT24(in_stack_fffffffffffffcfc,
                                                            in_stack_fffffffffffffcf8))),
             (char *)piVar9,(int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (int *)in_stack_fffffffffffffce0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar5) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x622cf3)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,type,in_stack_fffffffffffffd00,
               CONCAT13(uVar7,CONCAT12(uVar8,in_stack_fffffffffffffcfc)),(char *)piVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01,
               (Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x622d50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622da5);
  pstd::optional<int>::~optional((optional<int> *)0x622db2);
  return;
}

Assistant:

TEST(Optional, Basics) {
    pstd::optional<int> opt;

    EXPECT_FALSE(opt.has_value());

    opt = 1;
    EXPECT_TRUE(opt.has_value());
    EXPECT_TRUE((bool)opt);
    EXPECT_EQ(1, opt.value());
    EXPECT_EQ(1, *opt);

    opt.reset();
    EXPECT_FALSE(opt.has_value());
    EXPECT_FALSE((bool)opt);
    EXPECT_EQ(2, opt.value_or(2));
    opt = 1;
    EXPECT_EQ(1, opt.value_or(2));

    int x = 3;
    opt.reset();
    opt = std::move(x);
    EXPECT_TRUE(opt.has_value());
    EXPECT_EQ(3, opt.value());
}